

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O3

void __thiscall
chrono::robosimian::RoboSimian::RoboSimian
          (RoboSimian *this,ChContactMethod contact_method,bool has_sled,bool fixed)

{
  undefined8 uVar1;
  ChSystem *pCVar2;
  ContactManager *this_00;
  ChSystemSMC *this_01;
  ContactMaterial *this_02;
  void *this_03;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [64];
  
  this->m_owns_system = true;
  (this->m_chassis).super___shared_ptr<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->m_chassis).super___shared_ptr<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_sled).super___shared_ptr<chrono::robosimian::RS_Sled,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->m_sled).super___shared_ptr<chrono::robosimian::RS_Sled,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_sled).super___shared_ptr<chrono::robosimian::RS_Sled,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_limbs).
  super__Vector_base<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_limbs).
  super__Vector_base<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_limbs).
  super__Vector_base<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar5 = ZEXT464(0) << 0x40;
  this->m_wheel_mode = SPEED;
  this->m_chassis_material = (shared_ptr<chrono::ChMaterialSurface>)auVar5._0_16_;
  this->m_sled_material = (shared_ptr<chrono::ChMaterialSurface>)auVar5._16_16_;
  this->m_wheel_material = (shared_ptr<chrono::ChMaterialSurface>)auVar5._32_16_;
  this->m_link_material = (shared_ptr<chrono::ChMaterialSurface>)auVar5._48_16_;
  this->m_sled_material = (shared_ptr<chrono::ChMaterialSurface>)auVar5._0_16_;
  this->m_wheel_material = (shared_ptr<chrono::ChMaterialSurface>)auVar5._16_16_;
  this->m_link_material = (shared_ptr<chrono::ChMaterialSurface>)auVar5._32_16_;
  this->m_wheelDD_material = (shared_ptr<chrono::ChMaterialSurface>)auVar5._48_16_;
  auVar4._8_4_ = 0x3f4ccccd;
  auVar4._0_8_ = 0x3f4ccccd3f4ccccd;
  auVar4._12_4_ = 0x3f4ccccd;
  uVar1 = vmovlps_avx(auVar4);
  this->m_wheel_friction = (float)(int)uVar1;
  this->m_sled_friction = (float)(int)((ulong)uVar1 >> 0x20);
  (this->m_driver).super___shared_ptr<chrono::robosimian::RS_Driver,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->m_driver).super___shared_ptr<chrono::robosimian::RS_Driver,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (ContactManager *)operator_new(0x10);
  ContactManager::ContactManager(this_00);
  this->m_contact_reporter = this_00;
  this->m_material_override = (ContactMaterial *)0x0;
  (this->m_outdir)._M_dataplus._M_p = (pointer)&(this->m_outdir).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_outdir,"");
  (this->m_root)._M_dataplus._M_p = (pointer)&(this->m_root).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_root,"results","");
  this_03 = &this->field_0x108;
  lVar3 = 0;
  do {
    std::ofstream::ofstream(this_03);
    lVar3 = lVar3 + -0x200;
    this_03 = (void *)((long)this_03 + 0x200);
  } while (lVar3 != -0x800);
  if (contact_method == NSC) {
    this_01 = (ChSystemSMC *)operator_new(0x380);
    chrono::ChSystemNSC::ChSystemNSC((ChSystemNSC *)this_01,true);
  }
  else {
    this_01 = (ChSystemSMC *)operator_new(0x3a8);
    chrono::ChSystemSMC::ChSystemSMC(this_01,true);
  }
  this->m_system = (ChSystem *)this_01;
  *(undefined8 *)(this_01 + 0x168) = 0;
  *(undefined8 *)(this_01 + 0x170) = 0;
  *(undefined8 *)(this_01 + 0x178) = 0xc0239eb851eb851f;
  chrono::ChSystem::SetSolverMaxIterations((int)this_01);
  pCVar2 = this->m_system;
  *(undefined8 *)(pCVar2 + 0x200) = 0x4010000000000000;
  chrono::ChSystem::SetSolverType((Type)pCVar2);
  Create(this,has_sled,fixed);
  if (contact_method == NSC) {
    this_02 = (ContactMaterial *)operator_new(0x10);
    ContactMaterial::ContactMaterial(this_02,this);
    this->m_material_override = this_02;
  }
  return;
}

Assistant:

RoboSimian::RoboSimian(ChContactMethod contact_method, bool has_sled, bool fixed)
    : m_owns_system(true),
      m_wheel_mode(ActuationMode::SPEED),
      m_contact_reporter(new ContactManager),
      m_material_override(nullptr),
      m_sled_friction(0.8f),
      m_wheel_friction(0.8f),
      m_outdir(""),
      m_root("results") {
    m_system = (contact_method == ChContactMethod::NSC) ? static_cast<ChSystem*>(new ChSystemNSC)
                                                        : static_cast<ChSystem*>(new ChSystemSMC);
    m_system->Set_G_acc(ChVector<>(0, 0, -9.81));

    // Integration and Solver settings
    m_system->SetSolverMaxIterations(150);
    m_system->SetMaxPenetrationRecoverySpeed(4.0);
    m_system->SetSolverType(ChSolver::Type::BARZILAIBORWEIN);

    Create(has_sled, fixed);

    //// TODO: currently, only NSC multicore systems support user override of composite materials
    if (contact_method == ChContactMethod::NSC) {
        m_material_override = new ContactMaterial(this);
    }
}